

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByGeometryShaderCase::iterate
          (ReferencedByGeometryShaderCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  RenderContext *pRVar5;
  ProgramSources *pPVar6;
  TestLog *pTVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  undefined4 extraout_var_00;
  Enum<int,_2UL> EVar9;
  MessageBuilder local_d50;
  GetNameFunc local_bd0;
  int local_bc8;
  Enum<int,_2UL> local_bc0;
  MessageBuilder local_bb0;
  MessageBuilder local_a30;
  GLint local_8b0;
  GLsizei local_8ac;
  GLint referenced_1;
  GLsizei length_1;
  deUint32 resourcePos_1;
  deUint32 props_1 [1];
  CallLogWrapper gl_1;
  string local_880;
  allocator<char> local_859;
  string local_858;
  ScopedLogSection local_838;
  ScopedLogSection section_1;
  Enum<int,_2UL> local_6a0;
  MessageBuilder local_690;
  MessageBuilder local_510;
  GLint local_390;
  GLsizei local_38c;
  GLint referenced;
  GLsizei length;
  deUint32 resourcePos;
  deUint32 props [1];
  CallLogWrapper gl;
  string local_360;
  allocator<char> local_339;
  string local_338;
  ScopedLogSection local_318;
  ScopedLogSection section;
  string local_308;
  string local_2e8;
  ShaderSource local_2c8;
  ContextType local_2a0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  ShaderSource local_258;
  ContextType local_230 [5];
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  ShaderSource local_1d8;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  ReferencedByGeometryShaderCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,
             "${GLSL_VERSION_DECL}\nuniform highp vec4 u_position;\nvoid main (void)\n{\n\tgl_Position = u_position;\n}\n"
             ,&local_219);
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  local_230[0].super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  specializeShader(&local_1f8,&local_218,local_230);
  glu::VertexSource::VertexSource((VertexSource *)&local_1d8,&local_1f8);
  pPVar6 = glu::ProgramSources::operator<<(&local_1b0,&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_299);
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  local_2a0.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  specializeShader(&local_278,&local_298,&local_2a0);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_258,&local_278);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices=1) out;\nuniform highp vec4 u_offset;\nvoid main (void)\n{\n\tgl_Position = gl_in[0].gl_Position + u_offset;\n\tEmitVertex();\n}\n"
             ,(allocator<char> *)((long)&section.m_log + 7));
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  section.m_log._0_4_ = (*pRVar5->_vptr_RenderContext[2])();
  specializeShader(&local_2e8,&local_308,(ContextType *)&section);
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_2c8,&local_2e8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_2c8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar4,pPVar6);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)local_e0);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"UnreferencedUniform",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Unreferenced uniform u_position",
             (allocator<char> *)&gl.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar7,&local_338,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&gl.field_0x17);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&resourcePos,(Functions *)CONCAT44(extraout_var,iVar1),pTVar7);
  length = 0x9309;
  local_38c = 0;
  local_390 = 0;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&resourcePos,true);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  referenced = glu::CallLogWrapper::glGetProgramResourceIndex
                         ((CallLogWrapper *)&resourcePos,dVar2,0x92e1,"u_position");
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_510,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_510,(char (*) [28])"u_position resource index: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)&referenced);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_510);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramResourceiv
            ((CallLogWrapper *)&resourcePos,dVar2,0x92e1,referenced,1,(GLenum *)&length,1,&local_38c
             ,&local_390);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_690,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_690,(char (*) [45])"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_38c);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])" value(s), value[0] = ");
  EVar9 = glu::getBooleanStr(local_390);
  local_6a0.m_getName = EVar9.m_getName;
  local_6a0.m_value = EVar9.m_value;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_6a0);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_690);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&resourcePos);
  glu::checkError(GVar3,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14a4);
  if ((local_38c == 0) || (local_390 != 0)) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&section_1,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&section_1,(char (*) [26])"Error, expected GL_FALSE.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&resourcePos);
  tcu::ScopedLogSection::~ScopedLogSection(&local_318);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"ReferencedUniform",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"Referenced uniform u_offset",(allocator<char> *)&gl_1.field_0x17)
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_838,pTVar7,&local_858,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&gl_1.field_0x17);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&resourcePos_1,(Functions *)CONCAT44(extraout_var_00,iVar1),pTVar7);
  length_1 = 0x9309;
  local_8ac = 0;
  local_8b0 = 0;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&resourcePos_1,true);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  referenced_1 = glu::CallLogWrapper::glGetProgramResourceIndex
                           ((CallLogWrapper *)&resourcePos_1,dVar2,0x92e1,"u_offset");
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_a30,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_a30,(char (*) [26])"u_offset resource index: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)&referenced_1);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a30);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramResourceiv
            ((CallLogWrapper *)&resourcePos_1,dVar2,0x92e1,referenced_1,1,(GLenum *)&length_1,1,
             &local_8ac,&local_8b0);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_bb0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_bb0,(char (*) [45])"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_8ac);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])" value(s), value[0] = ");
  EVar9 = glu::getBooleanStr(local_8b0);
  local_bd0 = EVar9.m_getName;
  local_bc8 = EVar9.m_value;
  local_bc0.m_getName = local_bd0;
  local_bc0.m_value = local_bc8;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_bc0);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bb0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&resourcePos_1);
  glu::checkError(GVar3,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14bd);
  if ((local_8ac == 0) || (local_8b0 != 1)) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_d50,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_d50,(char (*) [25])"Error, expected GL_TRUE.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d50);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&resourcePos_1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_838);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return STOP;
}

Assistant:

ReferencedByGeometryShaderCase::IterateResult ReferencedByGeometryShaderCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"uniform highp vec4 u_position;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = u_position;\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main (void)\n"
													"{\n"
													"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
													"}\n";
		static const char* const geometrySource =	"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices=1) out;\n"
													"uniform highp vec4 u_offset;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = gl_in[0].gl_Position + u_offset;\n"
													"	EmitVertex();\n"
													"}\n";

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::ProgramSources()
																		<< glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																		<< glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																		<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));
		m_testCtx.getLog() << program;

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_position");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_position");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_position resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_FALSE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FALSE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_offset");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_offset");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_offset resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_TRUE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}
	}

	return STOP;
}